

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::protos::gen::FtraceConfig::~FtraceConfig(FtraceConfig *this)

{
  ~FtraceConfig(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

FtraceConfig::~FtraceConfig() = default;